

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O2

void __thiscall osc::OutboundPacketStream::CheckForAvailableBundleSpace(OutboundPacketStream *this)

{
  size_t sVar1;
  undefined8 *puVar2;
  
  sVar1 = Size(this);
  if (sVar1 + (ulong)(this->elementSizePtr_ != (uint32 *)0x0) * 4 + 0x10 <=
      (ulong)((long)this->end_ - (long)this->data_)) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  puVar2[1] = "out of buffer memory";
  *puVar2 = &PTR__exception_0019fb98;
  __cxa_throw(puVar2,&OutOfBufferMemoryException::typeinfo,std::exception::~exception);
}

Assistant:

void OutboundPacketStream::CheckForAvailableBundleSpace()
{
    std::size_t required = Size() + ((ElementSizeSlotRequired())?4:0) + 16;

    if( required > Capacity() )
        throw OutOfBufferMemoryException();
}